

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O2

void __thiscall
libtorrent::dht::anon_unknown_0::dht_default_storage::put_immutable_item
          (dht_default_storage *this,sha1_hash *target,span<const_char> buf,address *addr)

{
  _Rb_tree_header *p_Var1;
  int32_t *piVar2;
  _Link_type n;
  size_t *psVar3;
  uint uVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  unique_ptr<char[],_std::default_delete<char[]>_> uVar8;
  _Base_ptr p_Var9;
  bool bVar10;
  int iVar11;
  int iVar12;
  _Base_ptr *pp_Var13;
  _Base_ptr p_Var14;
  _Rb_tree_node_base *this_00;
  _Rb_tree_node_base *p_Var15;
  _Base_ptr p_Var16;
  _Base_ptr *pp_Var17;
  _Rb_tree_node_base *p_Var18;
  _Link_type __p;
  const_iterator __position;
  span<const_char> buf_00;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> local_160;
  undefined1 local_158 [144];
  dht_immutable_item to_add;
  
  p_Var1 = &(this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header;
  pp_Var17 = &(this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  pp_Var13 = pp_Var17;
  p_Var16 = (_Base_ptr)buf.m_len;
  p_Var15 = &p_Var1->_M_header;
  while (p_Var18 = *pp_Var13, p_Var18 != (_Rb_tree_node_base *)0x0) {
    bVar10 = digest32<160L>::operator<((digest32<160L> *)(p_Var18 + 1),target);
    if (!bVar10) {
      p_Var15 = p_Var18;
    }
    pp_Var13 = &p_Var18->_M_left + bVar10;
  }
  if (((_Rb_tree_header *)p_Var15 != p_Var1) &&
     (bVar10 = digest32<160L>::operator<(target,(digest32<160L> *)(p_Var15 + 1)), !bVar10))
  goto LAB_003528f0;
  sVar5 = (this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  iVar11 = (*this->m_settings->_vptr_settings_interface[5])();
  if (iVar11 <= (int)sVar5) {
    __position._M_node =
         (this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)__position._M_node != p_Var1) {
      p_Var9 = __position._M_node;
      p_Var14 = __position._M_node;
      while (__position._M_node = p_Var9, p_Var14 = (_Base_ptr)::std::_Rb_tree_increment(p_Var14),
            (_Rb_tree_header *)p_Var14 != p_Var1) {
        iVar11 = min_distance_exp((node_id *)(p_Var14 + 1),&this->m_node_ids);
        iVar12 = min_distance_exp((node_id *)(__position._M_node + 1),&this->m_node_ids);
        p_Var16 = p_Var14;
        p_Var9 = p_Var14;
        if (*(int *)&__position._M_node[6]._M_parent / 5 - iVar12 <=
            *(int *)&p_Var14[6]._M_parent / 5 - iVar11) {
          p_Var16 = __position._M_node;
          p_Var9 = __position._M_node;
        }
      }
    }
    ::std::
    _Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>_>
    ::_M_erase_aux(&(this->m_immutable_table)._M_t,__position);
    piVar2 = &(this->m_counters).immutable_data;
    *piVar2 = *piVar2 + -1;
  }
  memset(&to_add,0,0x98);
  buf_00.m_len = (difference_type)p_Var16;
  buf_00.m_ptr = (char *)buf.m_len;
  set_value((anon_unknown_0 *)&to_add,(dht_immutable_item *)buf.m_ptr,buf_00);
  uVar8 = to_add.value;
  uVar4 = (target->m_number)._M_elems[4];
  uVar6 = (target->m_number)._M_elems[0];
  uVar7 = (target->m_number)._M_elems[1];
  p_Var16 = *(_Base_ptr *)((target->m_number)._M_elems + 2);
  local_160._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_std::default_delete<char[]>_>)
       (tuple<char_*,_std::default_delete<char[]>_>)
       to_add.value._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  to_add.value._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)0x0;
  memcpy(local_158,&to_add.ips,0x90);
  this_00 = (_Rb_tree_node_base *)operator_new(0xd0);
  n = (_Link_type)(this_00 + 1);
  *(uint *)&this_00[1]._M_left = uVar4;
  local_160._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_std::default_delete<char[]>_>)
       (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)0x0;
  this_00[1]._M_color = uVar6;
  *(uint *)&this_00[1].field_0x4 = uVar7;
  this_00[1]._M_parent = p_Var16;
  this_00[1]._M_right =
       (_Base_ptr)
       uVar8._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  memcpy(this_00 + 2,local_158,0x90);
  bVar10 = true;
  p_Var18 = &p_Var1->_M_header;
  while (p_Var15 = *pp_Var17, p_Var15 != (_Rb_tree_node_base *)0x0) {
    bVar10 = digest32<160L>::operator<((digest32<160L> *)n,(digest32<160L> *)(p_Var15 + 1));
    p_Var18 = p_Var15;
    pp_Var17 = &p_Var15->_M_left + !bVar10;
  }
  p_Var15 = p_Var18;
  if (bVar10 == false) {
LAB_00352880:
    __p = n;
    bVar10 = digest32<160L>::operator<((digest32<160L> *)(p_Var15 + 1),(digest32<160L> *)n);
    if (bVar10) goto LAB_00352890;
    ::std::
    _Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>_>
    ::_M_drop_node((_Rb_tree<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>,_std::_Select1st<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>_>
                    *)this_00,__p);
  }
  else {
    if (p_Var18 != (this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      p_Var15 = (_Rb_tree_node_base *)::std::_Rb_tree_decrement(p_Var18);
      goto LAB_00352880;
    }
LAB_00352890:
    if (p_Var1 == (_Rb_tree_header *)p_Var18) {
      bVar10 = true;
    }
    else {
      bVar10 = digest32<160L>::operator<((digest32<160L> *)n,(digest32<160L> *)(p_Var18 + 1));
    }
    ::std::_Rb_tree_insert_and_rebalance(bVar10,this_00,p_Var18,&p_Var1->_M_header);
    psVar3 = &(this->m_immutable_table)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar3 = *psVar3 + 1;
    p_Var15 = this_00;
  }
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_160);
  piVar2 = &(this->m_counters).immutable_data;
  *piVar2 = *piVar2 + 1;
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&to_add.value);
LAB_003528f0:
  touch_item((dht_immutable_item *)&p_Var15[1]._M_right,addr);
  return;
}

Assistant:

void put_immutable_item(sha1_hash const& target
			, span<char const> buf
			, address const& addr) override
		{
			TORRENT_ASSERT(!m_node_ids.empty());
			auto i = m_immutable_table.find(target);
			if (i == m_immutable_table.end())
			{
				// make sure we don't add too many items
				if (int(m_immutable_table.size()) >= m_settings.get_int(settings_pack::dht_max_dht_items))
				{
					auto const j = pick_least_important_item(m_node_ids
						, m_immutable_table);

					TORRENT_ASSERT(j != m_immutable_table.end());
					m_immutable_table.erase(j);
					m_counters.immutable_data -= 1;
				}
				dht_immutable_item to_add;
				set_value(to_add, buf);

				std::tie(i, std::ignore) = m_immutable_table.insert(
					std::make_pair(target, std::move(to_add)));
				m_counters.immutable_data += 1;
			}

//			std::fprintf(stderr, "added immutable item (%d)\n", int(m_immutable_table.size()));

			touch_item(i->second, addr);
		}